

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O3

void __thiscall
cmDocumentation::SetSection
          (cmDocumentation *this,char *name,
          vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *docs)

{
  cmDocumentationSection *section;
  allocator local_6a;
  allocator local_69;
  string local_68;
  string local_48;
  
  section = (cmDocumentationSection *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_68,name,&local_6a);
  cmsys::SystemTools::UpperCase(&local_48,&local_68);
  std::__cxx11::string::string((string *)section,name,&local_69);
  (section->Entries).super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (section->Entries).super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (section->Entries).super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<cmDocumentationEntry_const*,std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>>>
            ((vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>> *)&section->Entries,
             (section->Entries).
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
             .super__Vector_impl_data._M_finish,
             (docs->super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>)
             ._M_impl.super__Vector_impl_data._M_start,
             (docs->super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>)
             ._M_impl.super__Vector_impl_data._M_finish);
  SetSection(this,name,section);
  return;
}

Assistant:

void cmDocumentation::SetSection(const char *name,
                                 std::vector<cmDocumentationEntry> &docs)
{
  cmDocumentationSection *sec =
    new cmDocumentationSection(name,
                               cmSystemTools::UpperCase(name).c_str());
  sec->Append(docs);
  this->SetSection(name,sec);
}